

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::InsertTypeTransition
          (BackwardPass *this,Instr *instrInsertBefore,StackSym *objSym,AddPropertyCacheBucket *data
          ,BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  RegOpnd *this_00;
  JITType *pJVar5;
  intptr_t iVar6;
  AddrOpnd *src2Opnd;
  AddrOpnd *dstOpnd;
  Instr *instr;
  JITTypeHandler *oldTypeHandler;
  JITTypeHandler *newTypeHandler;
  ObjectSymInfo *pOVar7;
  StackSym *pSVar8;
  int local_64;
  JITTypeHolderBase<void> JStack_60;
  int newCount;
  JITTypeHolder finalType;
  int oldCount;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder initialType;
  PropertyIndex inlineSlotCapacity;
  PropertyIndex newInlineSlotCapacity;
  
  if (this->currentPrePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1742,"(!this->IsPrePass())","!this->IsPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = IR::RegOpnd::New(objSym,TyInt64,this->func);
  IR::Opnd::SetIsJITOptimizedReg(&this_00->super_Opnd,true);
  JStack_60.t = (data->initialType).t;
  local_40.t = JStack_60.t;
  pJVar5 = JITTypeHolderBase<void>::operator->(&stack0xffffffffffffffa0);
  iVar6 = JITType::GetAddr(pJVar5);
  src2Opnd = IR::AddrOpnd::New(iVar6,AddrOpndKindDynamicType,this->func,false,(Var)0x0);
  src2Opnd->m_metadata = local_40.t;
  JStack_60.t = (data->finalType).t;
  finalType.t = JStack_60.t;
  pJVar5 = JITTypeHolderBase<void>::operator->(&finalType);
  iVar6 = JITType::GetAddr(pJVar5);
  dstOpnd = IR::AddrOpnd::New(iVar6,AddrOpndKindDynamicType,this->func,false,(Var)0x0);
  dstOpnd->m_metadata = JStack_60.t;
  instr = IR::Instr::New(AdjustObjType,&dstOpnd->super_Opnd,&this_00->super_Opnd,
                         &src2Opnd->super_Opnd,this->func);
  if (upwardExposedUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pJVar5 = JITTypeHolderBase<void>::operator->(&local_40);
    oldTypeHandler = JITType::GetTypeHandler(pJVar5);
    pJVar5 = JITTypeHolderBase<void>::operator->(&stack0xffffffffffffffa0);
    newTypeHandler = JITType::GetTypeHandler(pJVar5);
    bVar2 = JITTypeHandler::NeedSlotAdjustment
                      (oldTypeHandler,newTypeHandler,(int *)&finalType,&local_64,
                       (PropertyIndex *)((long)&initialType.t + 4),
                       (PropertyIndex *)((long)&initialType.t + 6));
    if (bVar2) {
      pSVar8 = this_00->m_sym;
      bVar2 = StackSym::HasObjectInfo(pSVar8);
      if (bVar2) {
        pOVar7 = StackSym::GetObjectInfo(pSVar8);
        pSVar8 = pOVar7->m_auxSlotPtrSym;
      }
      else {
        pSVar8 = (StackSym *)0x0;
      }
      if (pSVar8 != (StackSym *)0x0) {
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          (upwardExposedUses,(pSVar8->super_Sym).m_id);
        if (BVar3 != '\0') {
          instr->m_opcode = AdjustObjTypeReloadAuxSlotPtr;
        }
      }
    }
  }
  IR::Instr::InsertBefore(instrInsertBefore,instr);
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransition(IR::Instr *instrInsertBefore, StackSym *objSym, AddPropertyCacheBucket *data, BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    Assert(!this->IsPrePass());

    IR::RegOpnd *baseOpnd = IR::RegOpnd::New(objSym, TyMachReg, this->func);
    baseOpnd->SetIsJITOptimizedReg(true);

    JITTypeHolder initialType = data->GetInitialType();
    IR::AddrOpnd *initialTypeOpnd =
        IR::AddrOpnd::New(data->GetInitialType()->GetAddr(), IR::AddrOpndKindDynamicType, this->func);
    initialTypeOpnd->m_metadata = initialType.t;

    JITTypeHolder finalType = data->GetFinalType();
    IR::AddrOpnd *finalTypeOpnd =
        IR::AddrOpnd::New(data->GetFinalType()->GetAddr(), IR::AddrOpndKindDynamicType, this->func);
    finalTypeOpnd->m_metadata = finalType.t;

    IR::Instr *adjustTypeInstr =
        IR::Instr::New(Js::OpCode::AdjustObjType, finalTypeOpnd, baseOpnd, initialTypeOpnd, this->func);

    if (upwardExposedUses)
    {
        // If this type change causes a slot adjustment, the aux slot pointer (if any) will be reloaded here, so take it out of upwardExposedUses.
        int oldCount;
        int newCount;
        Js::PropertyIndex inlineSlotCapacity;
        Js::PropertyIndex newInlineSlotCapacity;
        bool needSlotAdjustment =
            JITTypeHandler::NeedSlotAdjustment(initialType->GetTypeHandler(), finalType->GetTypeHandler(), &oldCount, &newCount, &inlineSlotCapacity, &newInlineSlotCapacity);
        if (needSlotAdjustment)
        {
            StackSym *auxSlotPtrSym = baseOpnd->m_sym->GetAuxSlotPtrSym();
            if (auxSlotPtrSym)
            {
                if (upwardExposedUses->Test(auxSlotPtrSym->m_id))
                {
                    adjustTypeInstr->m_opcode = Js::OpCode::AdjustObjTypeReloadAuxSlotPtr;
                }
            }
        }
    }

    instrInsertBefore->InsertBefore(adjustTypeInstr);
}